

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

uint32 __thiscall
Js::RecyclableArgumentsObjectWalker::GetChildrenCount(RecyclableArgumentsObjectWalker *this)

{
  RecyclableArgumentsArrayWalker *pWalker;
  uint32 count;
  RecyclableArgumentsObjectWalker *this_local;
  
  if ((this->super_RecyclableObjectWalker).innerArrayObjectWalker == (RecyclableArrayWalker *)0x0) {
    this_local._4_4_ = RecyclableObjectWalker::GetChildrenCount(&this->super_RecyclableObjectWalker)
    ;
    if ((this->super_RecyclableObjectWalker).innerArrayObjectWalker != (RecyclableArrayWalker *)0x0)
    {
      RecyclableArgumentsArrayWalker::FetchFormalsAddress
                ((RecyclableArgumentsArrayWalker *)
                 (this->super_RecyclableObjectWalker).innerArrayObjectWalker,this->pLocalsWalker);
    }
  }
  else {
    this_local._4_4_ = RecyclableObjectWalker::GetChildrenCount(&this->super_RecyclableObjectWalker)
    ;
  }
  return this_local._4_4_;
}

Assistant:

uint32 RecyclableArgumentsObjectWalker::GetChildrenCount()
    {
        if (innerArrayObjectWalker == nullptr)
        {
            uint32 count = RecyclableObjectWalker::GetChildrenCount();
            if (innerArrayObjectWalker != nullptr)
            {
                RecyclableArgumentsArrayWalker *pWalker = static_cast<RecyclableArgumentsArrayWalker *> (innerArrayObjectWalker);
                pWalker->FetchFormalsAddress(pLocalsWalker);
            }
            return count;
        }

        return RecyclableObjectWalker::GetChildrenCount();
    }